

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::readDoubleConversionToBcd
          (DecimalQuantity *this,char *buffer,int32_t length,int32_t point)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if (length < 0x11) {
    lVar1 = 0;
    uVar2 = 0;
    if (0 < length) {
      uVar2 = (ulong)(uint)length;
    }
    iVar3 = length + -1;
    uVar4 = 0;
    for (; uVar2 * 4 != lVar1; lVar1 = lVar1 + 4) {
      uVar4 = uVar4 | (long)buffer[iVar3] + -0x30 << ((byte)lVar1 & 0x3f);
      iVar3 = iVar3 + -1;
    }
    (this->fBCD).bcdLong = uVar4;
  }
  else {
    ensureCapacity(this,length);
    lVar1 = 0;
    uVar2 = (ulong)(uint)length;
    while (uVar2 != 0) {
      (this->fBCD).bcdBytes.ptr[lVar1] = buffer[uVar2 - 1] + -0x30;
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 - 1;
    }
  }
  this->scale = point - length;
  this->precision = length;
  return;
}

Assistant:

void DecimalQuantity::readDoubleConversionToBcd(
        const char* buffer, int32_t length, int32_t point) {
    // NOTE: Despite the fact that double-conversion's API is called
    // "DoubleToAscii", they actually use '0' (as opposed to u8'0').
    if (length > 16) {
        ensureCapacity(length);
        for (int32_t i = 0; i < length; i++) {
            fBCD.bcdBytes.ptr[i] = buffer[length-i-1] - '0';
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < length; i++) {
            result |= static_cast<uint64_t>(buffer[length-i-1] - '0') << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = point - length;
    precision = length;
}